

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriterTests.cpp
# Opt level: O3

int testFileWriterTestsWriteDataWithOffset(void)

{
  pointer __s1;
  pointer puVar1;
  int iVar2;
  int iVar3;
  string *psVar4;
  ostream *poVar5;
  SpanSize<18446744073709551615UL> in_R8;
  difference_type __d2;
  pointer ptVar6;
  difference_type __d1;
  SpanSize<18446744073709551615UL> __n;
  pointer ptVar7;
  void *pvVar8;
  initializer_list<unsigned_char> __l;
  Span<const_unsigned_char,_18446744073709551615UL> data;
  Span<unsigned_char,_18446744073709551615UL> data_00;
  Span<unsigned_char,_18446744073709551615UL> data_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  AutoDeleteTempFile tempfile;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  undefined4 local_27c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_278;
  AutoDeleteTempFile local_260;
  undefined1 local_238 [16];
  pointer local_228;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&local_260);
  local_238._0_4_ = 0x281e140a;
  __l._M_len = 4;
  __l._M_array = local_238;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_278,__l,(allocator_type *)&local_27c);
  puVar1 = local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __s1 = local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  __n.m_size = (long)local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
  ptVar7 = (pointer)0x0;
  if (__n.m_size != 0) {
    ptVar7 = local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_260);
  MILBlob::Blob::FileWriter::FileWriter((FileWriter *)local_238,psVar4,true);
  data.m_size.m_size = __n.m_size;
  data.m_ptr = ptVar7;
  MILBlob::Blob::FileWriter::WriteData((FileWriter *)local_238,data,0x40);
  MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)local_238);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238,
             (long)local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(allocator_type *)&local_27c);
  ptVar6 = (pointer)(local_238._8_8_ + -(long)CONCAT44(local_238._4_4_,local_238._0_4_));
  pvVar8 = (void *)0x0;
  if (ptVar6 != (pointer)0x0) {
    pvVar8 = (void *)CONCAT44(local_238._4_4_,local_238._0_4_);
  }
  psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_260);
  data_00.m_size.m_size = in_R8.m_size;
  data_00.m_ptr = ptVar6;
  MILBlob::TestUtil::ReadBlobFile<unsigned_char>
            ((TestUtil *)psVar4,(string *)0x40,(uint64_t)pvVar8,data_00);
  if ((pointer)__n.m_size == ptVar6) {
    if (puVar1 != __s1) {
      iVar2 = bcmp(__s1,pvVar8,__n.m_size);
      if (iVar2 != 0) goto LAB_001b9ed1;
    }
    local_27c = 0;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_278);
    psVar4 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_260);
    iVar2 = 0;
    data_01.m_size.m_size = in_R8.m_size;
    data_01.m_ptr = (pointer)__n.m_size;
    MILBlob::TestUtil::ReadBlobFile<unsigned_char>
              ((TestUtil *)psVar4,(string *)0x0,(uint64_t)pvVar8,data_01);
    if (puVar1 == __s1) goto LAB_001b9f7e;
    iVar3 = bcmp(__s1,pvVar8,__n.m_size);
    if (iVar3 == 0) goto LAB_001b9f7e;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x79);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  }
  else {
LAB_001b9ed1:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x74);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  }
  std::ostream::put((char)poVar5);
  iVar2 = 1;
  std::ostream::flush();
LAB_001b9f7e:
  pvVar8 = (void *)CONCAT44(local_238._4_4_,local_238._0_4_);
  if (pvVar8 != (void *)0x0) {
    operator_delete(pvVar8,(long)local_228 - (long)pvVar8);
  }
  if (local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&local_260);
  return iVar2;
}

Assistant:

int testFileWriterTestsWriteDataWithOffset()
{
    AutoDeleteTempFile tempfile;
    // Writing to empty file
    {
        uint64_t offset = 64;
        std::vector<uint8_t> expected{10, 20, 30, 40};
        auto expectedSpan = Util::MakeSpan(expected);
        {
            FileWriter writer(tempfile.GetFilename(), /* truncateFile */ true);
            writer.WriteData(Util::SpanCast<uint8_t>(expectedSpan), offset);
        }
        std::vector<uint8_t> output(expected.size());
        auto outputSpan = Util::MakeSpan(output);
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), offset, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);

        // Writer writes 0s if offset is out of current file boundry
        expected = {0, 0, 0, 0};
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), 0, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);
    }

    return 0;
}